

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant
          (ScalarEvolutionAnalysis *this,Instruction *inst)

{
  IRContext *this_00;
  ConstantManager *this_01;
  uint32_t uVar1;
  int iVar2;
  int32_t iVar3;
  SENode *pSVar4;
  Constant *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar6;
  ulong integer;
  ScalarConstant *this_02;
  
  if (inst->opcode_ != OpConstant) {
    if (inst->opcode_ != OpConstantNull) {
      __assert_fail("inst->opcode() == spv::Op::OpConstant",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                    ,200,
                    "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction *)"
                   );
    }
    integer = 0;
LAB_005d0a92:
    pSVar4 = CreateConstant(this,integer);
    return pSVar4;
  }
  uVar6 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar6 = (uint)inst->has_result_id_;
  }
  if ((int)((ulong)((long)(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar6 != 1
     ) {
    __assert_fail("inst->NumInOperands() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                  ,0xc9,
                  "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction *)"
                 );
  }
  this_00 = this->context_;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  this_01 = (this_00->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  uVar1 = 0;
  if (inst->has_result_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
  }
  pCVar5 = analysis::ConstantManager::FindDeclaredConstant(this_01,uVar1);
  if (pCVar5 != (Constant *)0x0) {
    iVar2 = (*pCVar5->_vptr_Constant[0xe])(pCVar5);
    this_02 = (ScalarConstant *)CONCAT44(extraout_var,iVar2);
    if ((this_02 != (ScalarConstant *)0x0) &&
       (iVar2 = (*(this_02->super_Constant)._vptr_Constant[0x18])(this_02),
       ((long *)CONCAT44(extraout_var_00,iVar2))[1] - *(long *)CONCAT44(extraout_var_00,iVar2) == 4)
       ) {
      iVar2 = (*((this_02->super_Constant).type_)->_vptr_Type[10])();
      if (*(char *)(CONCAT44(extraout_var_01,iVar2) + 0x28) == '\x01') {
        iVar3 = analysis::IntConstant::GetS32BitValue((IntConstant *)this_02);
        integer = (ulong)iVar3;
      }
      else {
        uVar1 = analysis::ScalarConstant::GetU32BitValue(this_02);
        integer = (ulong)uVar1;
      }
      goto LAB_005d0a92;
    }
  }
  return this->cached_cant_compute_;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction* inst) {
  if (inst->opcode() == spv::Op::OpConstantNull) return CreateConstant(0);

  assert(inst->opcode() == spv::Op::OpConstant);
  assert(inst->NumInOperands() == 1);
  int64_t value = 0;

  // Look up the instruction in the constant manager.
  const analysis::Constant* constant =
      context_->get_constant_mgr()->FindDeclaredConstant(inst->result_id());

  if (!constant) return CreateCantComputeNode();

  const analysis::IntConstant* int_constant = constant->AsIntConstant();

  // Exit out if it is a 64 bit integer.
  if (!int_constant || int_constant->words().size() != 1)
    return CreateCantComputeNode();

  if (int_constant->type()->AsInteger()->IsSigned()) {
    value = int_constant->GetS32BitValue();
  } else {
    value = int_constant->GetU32BitValue();
  }

  return CreateConstant(value);
}